

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t psa_get_key_attributes(psa_key_handle_t handle,psa_key_attributes_t *attributes)

{
  psa_key_attributes_flag_t *ppVar1;
  mbedtls_rsa_context *ctx;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  psa_key_policy_t *ppVar5;
  psa_algorithm_t pVar6;
  psa_status_t pVar7;
  int iVar8;
  size_t __size;
  uchar *buf;
  mbedtls_mpi local_40;
  
  free(attributes->domain_parameters);
  attributes->domain_parameters = (void *)0x0;
  attributes->domain_parameters_size = 0;
  (attributes->core).policy.alg = 0;
  (attributes->core).policy.alg2 = 0;
  *(undefined8 *)&(attributes->core).flags = 0;
  (attributes->core).type = 0;
  (attributes->core).bits = 0;
  (attributes->core).lifetime = 0;
  (attributes->core).id = 0;
  (attributes->core).policy.usage = 0;
  local_40._0_8_ = (psa_key_slot_t *)0x0;
  pVar7 = psa_get_key_slot(handle,(psa_key_slot_t **)&local_40);
  if (pVar7 != 0) {
    return pVar7;
  }
  uVar2 = *(undefined8 *)local_40._0_8_;
  uVar3 = *(undefined8 *)(local_40._0_8_ + 8);
  ppVar5 = (psa_key_policy_t *)(local_40._0_8_ + 0xc);
  pVar6 = ppVar5->alg;
  uVar4 = *(undefined8 *)(local_40._0_8_ + 0x14);
  (attributes->core).policy.usage = ppVar5->usage;
  (attributes->core).policy.alg = pVar6;
  *(undefined8 *)&(attributes->core).policy.alg2 = uVar4;
  (attributes->core).type = (short)uVar2;
  (attributes->core).bits = (short)((ulong)uVar2 >> 0x10);
  (attributes->core).lifetime = (int)((ulong)uVar2 >> 0x20);
  *(undefined8 *)&(attributes->core).id = uVar3;
  ppVar1 = &(attributes->core).flags;
  *ppVar1 = *ppVar1 & 1;
  if ((*(short *)local_40._0_8_ != 0x7001) && (*(short *)local_40._0_8_ != 0x4001)) {
    return 0;
  }
  ctx = ((anon_union_16_3_eb86bdaa_for_data *)(local_40._0_8_ + 0x20))->rsa;
  mbedtls_mpi_init(&local_40);
  buf = (uchar *)0x0;
  iVar8 = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                             (mbedtls_mpi *)0x0,&local_40);
  if (iVar8 == 0) {
    iVar8 = mbedtls_mpi_cmp_int(&local_40,0x10001);
    if (iVar8 == 0) {
LAB_00127442:
      mbedtls_mpi_free(&local_40);
      iVar8 = 0;
      goto LAB_001273b6;
    }
    __size = mbedtls_mpi_size(&local_40);
    buf = (uchar *)calloc(1,__size);
    if (buf == (uchar *)0x0) {
      iVar8 = -0x10;
      buf = (uchar *)0x0;
    }
    else {
      iVar8 = mbedtls_mpi_write_binary(&local_40,buf,__size);
      if (iVar8 == 0) {
        attributes->domain_parameters = buf;
        attributes->domain_parameters_size = __size;
        goto LAB_00127442;
      }
    }
  }
  mbedtls_mpi_free(&local_40);
  free(buf);
LAB_001273b6:
  pVar7 = mbedtls_to_psa_error(iVar8);
  if (pVar7 == 0) {
    return 0;
  }
  free(attributes->domain_parameters);
  attributes->domain_parameters = (void *)0x0;
  attributes->domain_parameters_size = 0;
  (attributes->core).policy.alg = 0;
  (attributes->core).policy.alg2 = 0;
  *(undefined8 *)&(attributes->core).flags = 0;
  (attributes->core).type = 0;
  (attributes->core).bits = 0;
  (attributes->core).lifetime = 0;
  (attributes->core).id = 0;
  (attributes->core).policy.usage = 0;
  return pVar7;
}

Assistant:

psa_status_t psa_get_key_attributes( psa_key_handle_t handle,
                                     psa_key_attributes_t *attributes )
{
    psa_key_slot_t *slot;
    psa_status_t status;

    psa_reset_key_attributes( attributes );

    status = psa_get_key_from_slot( handle, &slot, 0, 0 );
    if( status != PSA_SUCCESS )
        return( status );

    attributes->core = slot->attr;
    attributes->core.flags &= ( MBEDTLS_PSA_KA_MASK_EXTERNAL_ONLY |
                                MBEDTLS_PSA_KA_MASK_DUAL_USE );

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( psa_key_slot_is_external( slot ) )
        psa_set_key_slot_number( attributes, slot->data.se.slot_number );
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    switch( slot->attr.type )
    {
#if defined(MBEDTLS_RSA_C)
        case PSA_KEY_TYPE_RSA_KEY_PAIR:
        case PSA_KEY_TYPE_RSA_PUBLIC_KEY:
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
            /* TODO: reporting the public exponent for opaque keys
             * is not yet implemented.
             * https://github.com/ARMmbed/mbed-crypto/issues/216
             */
            if( psa_key_slot_is_external( slot ) )
                break;
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
            status = psa_get_rsa_public_exponent( slot->data.rsa, attributes );
            break;
#endif /* MBEDTLS_RSA_C */
        default:
            /* Nothing else to do. */
            break;
    }

    if( status != PSA_SUCCESS )
        psa_reset_key_attributes( attributes );
    return( status );
}